

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void Sophus::defaultEnsure<Eigen::Transpose<Eigen::Matrix<float,4,1,0,4,1>>>
               (char *function,char *file,int line,char *description,
               Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *args)

{
  ostream *poVar1;
  Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *args_00;
  string sStack_38;
  
  args_00 = (Transpose<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(ulong)(uint)line;
  printf("Sophus ensure failed in function \'%s\', file \'%s\', line %d.\n",function,file);
  details::FormatString<Eigen::Transpose<Eigen::Matrix<float,4,1,0,4,1>>>
            (&sStack_38,(details *)description,(char *)args,args_00);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  abort();
}

Assistant:

SOPHUS_FUNC void defaultEnsure(char const* function, char const* file, int line,
                               char const* description, Args&&... args) {
  std::printf("Sophus ensure failed in function '%s', file '%s', line %d.\n",
              function, file, line);
#ifdef __CUDACC__
  std::printf("%s", description);
#else
  std::cout << details::FormatString(description, std::forward<Args>(args)...)
            << std::endl;
  std::abort();
#endif
}